

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_def.c
# Opt level: O1

_Bool upb_EnumDef_MiniDescriptorEncode(upb_EnumDef *e,upb_Arena *a,upb_StringView *out)

{
  bool bVar1;
  _Bool _Var2;
  uint32_t val;
  upb_EnumValueDef **ppuVar3;
  upb_EnumValueDef *v;
  uint32_t uVar4;
  long lVar5;
  upb_DescState s;
  upb_DescState local_70;
  
  local_70.bufsize = 0x20;
  local_70.buf = (char *)0x0;
  local_70.ptr = (char *)0x0;
  if (e->is_sorted == false) {
    ppuVar3 = _upb_EnumValueDefs_Sorted(e->values,e->value_count,a);
    if (ppuVar3 == (upb_EnumValueDef **)0x0) {
      return false;
    }
  }
  else {
    ppuVar3 = (upb_EnumValueDef **)0x0;
  }
  _Var2 = _upb_DescState_Grow(&local_70,a);
  if (_Var2) {
    local_70.ptr = upb_MtDataEncoder_StartEnum(&local_70.e,local_70.ptr);
    if (0 < e->value_count) {
      lVar5 = 0;
      uVar4 = 0;
      do {
        if (ppuVar3 == (upb_EnumValueDef **)0x0) {
          v = upb_EnumDef_Value(e,(int)lVar5);
        }
        else {
          v = ppuVar3[lVar5];
        }
        val = upb_EnumValueDef_Number(v);
        if ((lVar5 == 0) || (bVar1 = false, uVar4 != val)) {
          _Var2 = _upb_DescState_Grow(&local_70,a);
          bVar1 = true;
          if (_Var2) {
            local_70.ptr = upb_MtDataEncoder_PutEnumValue(&local_70.e,local_70.ptr,val);
            bVar1 = false;
            uVar4 = val;
          }
        }
        if (bVar1) {
          return false;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < e->value_count);
    }
    _Var2 = _upb_DescState_Grow(&local_70,a);
    if (_Var2) {
      local_70.ptr = upb_MtDataEncoder_EndEnum(&local_70.e,local_70.ptr);
      if (local_70.buf + local_70.bufsize <= local_70.ptr) {
        __assert_fail("s.ptr < s.buf + s.bufsize",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/upb/reflection/enum_def.c"
                      ,0xcc,
                      "_Bool upb_EnumDef_MiniDescriptorEncode(const upb_EnumDef *, upb_Arena *, upb_StringView *)"
                     );
      }
      *local_70.ptr = '\0';
      out->data = local_70.buf;
      out->size = (long)local_70.ptr - (long)local_70.buf;
      return true;
    }
  }
  return false;
}

Assistant:

bool upb_EnumDef_MiniDescriptorEncode(const upb_EnumDef* e, upb_Arena* a,
                                      upb_StringView* out) {
  upb_DescState s;
  _upb_DescState_Init(&s);

  const upb_EnumValueDef** sorted = NULL;
  if (!e->is_sorted) {
    sorted = _upb_EnumValueDefs_Sorted(e->values, e->value_count, a);
    if (!sorted) return false;
  }

  if (!_upb_DescState_Grow(&s, a)) return false;
  s.ptr = upb_MtDataEncoder_StartEnum(&s.e, s.ptr);

  // Duplicate values are allowed but we only encode each value once.
  uint32_t previous = 0;

  for (int i = 0; i < e->value_count; i++) {
    const uint32_t current =
        upb_EnumValueDef_Number(sorted ? sorted[i] : upb_EnumDef_Value(e, i));
    if (i != 0 && previous == current) continue;

    if (!_upb_DescState_Grow(&s, a)) return false;
    s.ptr = upb_MtDataEncoder_PutEnumValue(&s.e, s.ptr, current);
    previous = current;
  }

  if (!_upb_DescState_Grow(&s, a)) return false;
  s.ptr = upb_MtDataEncoder_EndEnum(&s.e, s.ptr);

  // There will always be room for this '\0' in the encoder buffer because
  // kUpb_MtDataEncoder_MinSize is overkill for upb_MtDataEncoder_EndEnum().
  UPB_ASSERT(s.ptr < s.buf + s.bufsize);
  *s.ptr = '\0';

  out->data = s.buf;
  out->size = s.ptr - s.buf;
  return true;
}